

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void __thiscall cmInstallGenerator::~cmInstallGenerator(cmInstallGenerator *this)

{
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallGenerator_00539730;
  std::__cxx11::string::~string((string *)&this->Component);
  std::__cxx11::string::~string((string *)&this->Destination);
  cmScriptGenerator::~cmScriptGenerator(&this->super_cmScriptGenerator);
  return;
}

Assistant:

cmInstallGenerator::~cmInstallGenerator() = default;